

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

void __thiscall
Component_removeComponentMethods_Test::Component_removeComponentMethods_Test
          (Component_removeComponentMethods_Test *this)

{
  Component_removeComponentMethods_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Component_removeComponentMethods_Test_00139c90;
  return;
}

Assistant:

TEST(Component, removeComponentMethods)
{
    const std::string e1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component/>\n"
        "  <component name=\"child2\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref>\n"
        "      <component_ref component=\"child2\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    const std::string e2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component/>\n"
        "  <component name=\"child2\"/>\n"
        "  <component name=\"child1\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref>\n"
        "      <component_ref component=\"child2\"/>\n"
        "      <component_ref component=\"child1\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    const std::string e3 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component/>\n"
        "</model>\n";
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    c1->setName("child1");
    c2->setName("child2");
    c->addComponent(c1);
    c->addComponent(c2);

    EXPECT_EQ(size_t(2), c->componentCount());
    EXPECT_TRUE(c->removeComponent(0));
    EXPECT_EQ(size_t(1), c->componentCount());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e1, a);
    // No longer a component at position 1.
    EXPECT_FALSE(c->removeComponent(1));

    // This will add three children 'c1'.
    c->addComponent(c1);
    c->addComponent(c1);
    c->addComponent(c1);
    // Remove the occurrence of "child1".
    EXPECT_TRUE(c->removeComponent("child1"));
    // Can remove a second occurrence of "child1".
    EXPECT_TRUE(c->removeComponent(c1));
    // Still have component 'c2', and one last 'c1'.
    EXPECT_EQ(size_t(2), c->componentCount());
    a = printer->printModel(m);
    EXPECT_EQ(e2, a);

    // Expect no change
    EXPECT_FALSE(c->removeComponent("child3"));
    EXPECT_FALSE(c->removeComponent(c3));
    EXPECT_EQ(size_t(2), c->componentCount());

    c->removeAllComponents();
    a = printer->printModel(m);
    EXPECT_EQ(e3, a);
    EXPECT_EQ(size_t(0), c->componentCount());
}